

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

float * stbir__add_empty_ring_buffer_entry(stbir__info *stbir_info,int n)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  
  stbir_info->ring_buffer_last_scanline = n;
  iVar1 = stbir_info->ring_buffer_begin_index;
  if (iVar1 < 0) {
    stbir_info->ring_buffer_begin_index = 0;
    stbir_info->ring_buffer_first_scanline = n;
    iVar3 = 0;
  }
  else {
    iVar3 = ((n + iVar1) - stbir_info->ring_buffer_first_scanline) %
            stbir_info->ring_buffer_num_entries;
    if (iVar3 == iVar1) {
      __assert_fail("ring_buffer_index != stbir_info->ring_buffer_begin_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                    ,0x598,"float *stbir__add_empty_ring_buffer_entry(stbir__info *, int)");
    }
  }
  pfVar2 = (float *)memset(stbir_info->ring_buffer +
                           (stbir_info->ring_buffer_length_bytes >> 2) * iVar3,0,
                           (long)stbir_info->ring_buffer_length_bytes);
  return pfVar2;
}

Assistant:

static float* stbir__add_empty_ring_buffer_entry(stbir__info* stbir_info, int n)
{
    int ring_buffer_index;
    float* ring_buffer;

    stbir_info->ring_buffer_last_scanline = n;

    if (stbir_info->ring_buffer_begin_index < 0)
    {
        ring_buffer_index = stbir_info->ring_buffer_begin_index = 0;
        stbir_info->ring_buffer_first_scanline = n;
    }
    else
    {
        ring_buffer_index = (stbir_info->ring_buffer_begin_index + (stbir_info->ring_buffer_last_scanline - stbir_info->ring_buffer_first_scanline)) % stbir_info->ring_buffer_num_entries;
        STBIR_ASSERT(ring_buffer_index != stbir_info->ring_buffer_begin_index);
    }

    ring_buffer = stbir__get_ring_buffer_entry(stbir_info->ring_buffer, ring_buffer_index, stbir_info->ring_buffer_length_bytes / sizeof(float));
    memset(ring_buffer, 0, stbir_info->ring_buffer_length_bytes);

    return ring_buffer;
}